

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O1

void __thiscall
lunasvg::SVGEllipseElement::SVGEllipseElement(SVGEllipseElement *this,Document *document)

{
  SVGGraphicsElement::SVGGraphicsElement((SVGGraphicsElement *)this,document,Ellipse);
  (this->super_SVGGeometryElement).super_SVGGraphicsElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGGeometryElement_001593d0;
  (this->super_SVGGeometryElement).m_path.m_data = (plutovg_path_t *)0x0;
  (this->super_SVGGeometryElement).m_fillBoundingBox.x = 0.0;
  (this->super_SVGGeometryElement).m_fillBoundingBox.y = 0.0;
  (this->super_SVGGeometryElement).m_fillBoundingBox.w = 0.0;
  (this->super_SVGGeometryElement).m_fillBoundingBox.h = 0.0;
  (this->super_SVGGeometryElement).m_strokeData.m_lineWidth = 1.0;
  (this->super_SVGGeometryElement).m_strokeData.m_miterLimit = 4.0;
  (this->super_SVGGeometryElement).m_strokeData.m_dashOffset = 0.0;
  (this->super_SVGGeometryElement).m_strokeData.m_lineCap = Butt;
  (this->super_SVGGeometryElement).m_strokeData.m_lineJoin = Miter;
  (this->super_SVGGeometryElement).m_strokeData.m_dashArray.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->super_SVGGeometryElement).m_strokeData.m_dashArray.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->super_SVGGeometryElement).m_strokeData.m_dashArray.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_SVGGeometryElement).m_fill.m_element = (SVGPaintElement *)0x0;
  (this->super_SVGGeometryElement).m_fill.m_color.m_value = 0;
  (this->super_SVGGeometryElement).m_fill.m_opacity = 0.0;
  (this->super_SVGGeometryElement).m_stroke.m_element = (SVGPaintElement *)0x0;
  (this->super_SVGGeometryElement).m_stroke.m_color.m_value = 0;
  *(undefined8 *)&(this->super_SVGGeometryElement).m_stroke.m_opacity = 0;
  *(undefined8 *)
   ((long)&(this->super_SVGGeometryElement).m_markerPositions.
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_SVGGeometryElement).m_markerPositions.
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->super_SVGGeometryElement).m_markerPositions.
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->super_SVGGeometryElement).super_SVGGraphicsElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGEllipseElement_001595c8;
  SVGProperty::SVGProperty(&(this->m_cx).super_SVGProperty,Cx);
  (this->m_cx).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_cx).super_SVGProperty.field_0x9 = 0;
  *(undefined4 *)&(this->m_cx).super_SVGProperty.field_0xc = 0;
  (this->m_cx).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_cy).super_SVGProperty,Cy);
  (this->m_cy).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_cy).super_SVGProperty.field_0x9 = 1;
  *(undefined4 *)&(this->m_cy).super_SVGProperty.field_0xc = 0;
  (this->m_cy).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_rx).super_SVGProperty,Rx);
  (this->m_rx).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_rx).super_SVGProperty.field_0x9 = 0x102;
  *(undefined4 *)&(this->m_rx).super_SVGProperty.field_0xc = 0;
  (this->m_rx).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_ry).super_SVGProperty,Ry);
  (this->m_ry).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_ry).super_SVGProperty.field_0x9 = 0x102;
  *(undefined4 *)&(this->m_ry).super_SVGProperty.field_0xc = 0;
  (this->m_ry).field_0x10 = 0;
  SVGElement::addProperty((SVGElement *)this,&(this->m_cx).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_cy).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_rx).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_ry).super_SVGProperty);
  return;
}

Assistant:

SVGEllipseElement::SVGEllipseElement(Document* document)
    : SVGGeometryElement(document, ElementID::Ellipse)
    , m_cx(PropertyID::Cx, LengthDirection::Horizontal, LengthNegativeMode::Allow)
    , m_cy(PropertyID::Cy, LengthDirection::Vertical, LengthNegativeMode::Allow)
    , m_rx(PropertyID::Rx, LengthDirection::Diagonal, LengthNegativeMode::Forbid)
    , m_ry(PropertyID::Ry, LengthDirection::Diagonal, LengthNegativeMode::Forbid)
{
    addProperty(m_cx);
    addProperty(m_cy);
    addProperty(m_rx);
    addProperty(m_ry);
}